

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O1

void touch_file(char *name)

{
  char *path;
  size_t sVar1;
  uint file;
  int iVar2;
  int iVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  size_t sVar6;
  uv_buf_t *bufs;
  int extraout_EDX;
  __pthread_internal_list *unaff_RBX;
  long lVar7;
  code *handle;
  uv_fs_event_t *puVar8;
  uv_timer_t *loop;
  uv_fs_t *unaff_R14;
  uv_fs_t req;
  size_t sStackY_848;
  char acStackY_840 [1032];
  uv_loop_t *puStackY_438;
  uv_fs_event_t uStackY_3f8;
  uv_fs_event_t uStackY_370;
  undefined1 auStackY_2e8 [16];
  code *pcStackY_2d8;
  code *pcStackY_2d0;
  code *apcStackY_2c8 [3];
  code *pcStackY_2b0;
  undefined1 auStackY_2a0 [176];
  uv_fs_t *puStackY_1f0;
  uv_buf_t local_1d8;
  uv_fs_t local_1c8;
  
  iVar3 = 2;
  puStackY_1f0 = (uv_fs_t *)0x14eb2a;
  file = uv_fs_open((uv_loop_t *)0x0,&local_1c8,name,2,0,(uv_fs_cb)0x0);
  if ((int)file < 0) {
    puStackY_1f0 = (uv_fs_t *)0x14ebbc;
    touch_file_cold_1();
LAB_0014ebbc:
    puStackY_1f0 = (uv_fs_t *)0x14ebc1;
    touch_file_cold_2();
  }
  else {
    unaff_RBX = (__pthread_internal_list *)(ulong)file;
    unaff_R14 = &local_1c8;
    puStackY_1f0 = (uv_fs_t *)0x14eb41;
    uv_fs_req_cleanup(unaff_R14);
    puStackY_1f0 = (uv_fs_t *)0x14eb52;
    local_1d8 = uv_buf_init("foo",4);
    bufs = &local_1d8;
    puStackY_1f0 = (uv_fs_t *)0x14eb7f;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,unaff_R14,file,bufs,1,-1,(uv_fs_cb)0x0);
    iVar3 = (int)bufs;
    if (iVar2 < 0) goto LAB_0014ebbc;
    unaff_R14 = &local_1c8;
    puStackY_1f0 = (uv_fs_t *)0x14eb90;
    uv_fs_req_cleanup(unaff_R14);
    iVar3 = 0;
    puStackY_1f0 = (uv_fs_t *)0x14eb9e;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,unaff_R14,file,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      puStackY_1f0 = (uv_fs_t *)0x14ebac;
      uv_fs_req_cleanup(&local_1c8);
      return;
    }
  }
  puStackY_1f0 = (uv_fs_t *)run_test_fs_event_no_callback_on_close;
  touch_file_cold_3();
  auStackY_2a0._152_8_ = 0x14ebcf;
  auStackY_2a0._168_8_ = unaff_RBX;
  puStackY_1f0 = unaff_R14;
  puVar4 = uv_default_loop();
  auStackY_2a0._152_8_ = 0x14ebe1;
  remove("watch_dir/file1");
  auStackY_2a0._152_8_ = 0x14ebed;
  remove("watch_dir/");
  auStackY_2a0._152_8_ = 0x14ebf9;
  create_dir("watch_dir");
  auStackY_2a0._152_8_ = 0x14ec01;
  create_file("watch_dir/file1");
  auStackY_2a0._152_8_ = 0x14ec10;
  iVar2 = uv_fs_event_init(puVar4,&fs_event);
  if (iVar2 == 0) {
    iVar3 = 0;
    auStackY_2a0._152_8_ = 0x14ec34;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file1",0);
    if (iVar2 != 0) goto LAB_0014ecc6;
    auStackY_2a0._152_8_ = 0x14ec4f;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    auStackY_2a0._152_8_ = 0x14ec59;
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (fs_event_cb_called != 0) goto LAB_0014eccb;
    if (close_cb_called != 1) goto LAB_0014ecd0;
    auStackY_2a0._152_8_ = 0x14ec77;
    remove("watch_dir/file1");
    auStackY_2a0._152_8_ = 0x14ec83;
    remove("watch_dir/");
    auStackY_2a0._152_8_ = 0x14ec88;
    puVar4 = uv_default_loop();
    auStackY_2a0._152_8_ = 0x14ec9c;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    auStackY_2a0._152_8_ = 0x14eca6;
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStackY_2a0._152_8_ = 0x14ecab;
    puVar5 = uv_default_loop();
    auStackY_2a0._152_8_ = 0x14ecb3;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    auStackY_2a0._152_8_ = 0x14ecc6;
    run_test_fs_event_no_callback_on_close_cold_1();
LAB_0014ecc6:
    auStackY_2a0._152_8_ = 0x14eccb;
    run_test_fs_event_no_callback_on_close_cold_2();
LAB_0014eccb:
    auStackY_2a0._152_8_ = 0x14ecd0;
    run_test_fs_event_no_callback_on_close_cold_3();
LAB_0014ecd0:
    auStackY_2a0._152_8_ = 0x14ecd5;
    run_test_fs_event_no_callback_on_close_cold_4();
  }
  auStackY_2a0._152_8_ = run_test_fs_event_immediate_close;
  run_test_fs_event_no_callback_on_close_cold_5();
  pcStackY_2b0 = (code *)0x14ece7;
  auStackY_2a0._152_8_ = puVar4;
  puVar5 = uv_default_loop();
  pcStackY_2b0 = (code *)0x14ecf7;
  puVar4 = puVar5;
  iVar2 = uv_timer_init(puVar5,(uv_timer_t *)auStackY_2a0);
  if (iVar2 == 0) {
    puVar4 = (uv_loop_t *)auStackY_2a0;
    iVar3 = 0;
    pcStackY_2b0 = (code *)0x14ed13;
    iVar2 = uv_timer_start((uv_timer_t *)puVar4,timer_cb,1,0);
    if (iVar2 != 0) goto LAB_0014ed6e;
    pcStackY_2b0 = (code *)0x14ed21;
    puVar4 = puVar5;
    uv_run(puVar5,UV_RUN_DEFAULT);
    if (close_cb_called != 2) goto LAB_0014ed73;
    pcStackY_2b0 = (code *)0x14ed2f;
    puVar5 = uv_default_loop();
    pcStackY_2b0 = (code *)0x14ed43;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    pcStackY_2b0 = (code *)0x14ed4d;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStackY_2b0 = (code *)0x14ed52;
    puVar4 = uv_default_loop();
    pcStackY_2b0 = (code *)0x14ed5a;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStackY_2b0 = (code *)0x14ed6e;
    run_test_fs_event_immediate_close_cold_1();
LAB_0014ed6e:
    pcStackY_2b0 = (code *)0x14ed73;
    run_test_fs_event_immediate_close_cold_2();
LAB_0014ed73:
    pcStackY_2b0 = (code *)0x14ed78;
    run_test_fs_event_immediate_close_cold_3();
  }
  pcStackY_2b0 = timer_cb;
  run_test_fs_event_immediate_close_cold_4();
  pcStackY_2b0 = (code *)0x192f2e;
  apcStackY_2c8[0] = (code *)0x14ed94;
  apcStackY_2c8[2] = (code *)puVar5;
  iVar2 = uv_fs_event_init(*(uv_loop_t **)&puVar4->active_handles,&fs_event);
  if (iVar2 == 0) {
    iVar3 = 0;
    apcStackY_2c8[0] = (code *)0x14edb4;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,".",0);
    if (iVar2 == 0) {
      apcStackY_2c8[0] = (code *)0x14edce;
      uv_close((uv_handle_t *)&fs_event,close_cb);
      uv_close((uv_handle_t *)puVar4,close_cb);
      return;
    }
  }
  else {
    apcStackY_2c8[0] = (code *)0x14ede5;
    timer_cb_cold_1();
  }
  apcStackY_2c8[0] = run_test_fs_event_close_with_pending_event;
  timer_cb_cold_2();
  pcStackY_2d0 = (code *)0x14edf0;
  apcStackY_2c8[0] = (code *)puVar4;
  puVar4 = uv_default_loop();
  pcStackY_2d0 = (code *)0x14edff;
  create_dir("watch_dir");
  pcStackY_2d0 = (code *)0x14ee0b;
  create_file("watch_dir/file");
  pcStackY_2d0 = (code *)0x14ee1a;
  iVar2 = uv_fs_event_init(puVar4,&fs_event);
  if (iVar2 == 0) {
    iVar3 = 0;
    pcStackY_2d0 = (code *)0x14ee3e;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir",0);
    if (iVar2 != 0) goto LAB_0014eecd;
    pcStackY_2d0 = (code *)0x14ee52;
    touch_file("watch_dir/file");
    pcStackY_2d0 = (code *)0x14ee65;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    pcStackY_2d0 = (code *)0x14ee6f;
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_0014eed2;
    pcStackY_2d0 = (code *)0x14ee84;
    remove("watch_dir/file");
    pcStackY_2d0 = (code *)0x14ee90;
    remove("watch_dir/");
    pcStackY_2d0 = (code *)0x14ee95;
    puVar4 = uv_default_loop();
    pcStackY_2d0 = (code *)0x14eea9;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    pcStackY_2d0 = (code *)0x14eeb3;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStackY_2d0 = (code *)0x14eeb8;
    puVar5 = uv_default_loop();
    pcStackY_2d0 = (code *)0x14eec0;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStackY_2d0 = (code *)0x14eecd;
    run_test_fs_event_close_with_pending_event_cold_1();
LAB_0014eecd:
    pcStackY_2d0 = (code *)0x14eed2;
    run_test_fs_event_close_with_pending_event_cold_2();
LAB_0014eed2:
    pcStackY_2d0 = (code *)0x14eed7;
    run_test_fs_event_close_with_pending_event_cold_3();
  }
  pcStackY_2d0 = run_test_fs_event_close_in_callback;
  run_test_fs_event_close_with_pending_event_cold_4();
  pcStackY_2d8 = (code *)0x14eee2;
  pcStackY_2d0 = (code *)puVar4;
  puVar4 = uv_default_loop();
  pcStackY_2d8 = (code *)0x14eeec;
  fs_event_unlink_files((uv_timer_t *)0x0);
  pcStackY_2d8 = (code *)0x14eef8;
  create_dir("watch_dir");
  pcStackY_2d8 = (code *)0x14ef07;
  loop = (uv_timer_t *)puVar4;
  iVar2 = uv_fs_event_init(puVar4,&fs_event);
  if (iVar2 == 0) {
    puVar8 = &fs_event;
    iVar3 = 0;
    pcStackY_2d8 = (code *)0x14ef2b;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir",0);
    loop = (uv_timer_t *)puVar8;
    if (iVar2 != 0) goto LAB_0014eff8;
    pcStackY_2d8 = (code *)0x14ef42;
    loop = (uv_timer_t *)puVar4;
    iVar2 = uv_timer_init(puVar4,&timer);
    if (iVar2 != 0) goto LAB_0014effd;
    loop = &timer;
    iVar3 = 0;
    pcStackY_2d8 = (code *)0x14ef64;
    iVar2 = uv_timer_start(&timer,fs_event_create_files,100,0);
    if (iVar2 != 0) goto LAB_0014f002;
    pcStackY_2d8 = (code *)0x14ef76;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStackY_2d8 = (code *)0x14ef89;
    uv_close((uv_handle_t *)&timer,close_cb);
    pcStackY_2d8 = (code *)0x14ef96;
    loop = (uv_timer_t *)puVar4;
    uv_run(puVar4,UV_RUN_ONCE);
    if (close_cb_called != 2) goto LAB_0014f007;
    if (fs_event_cb_called != 3) goto LAB_0014f00c;
    pcStackY_2d8 = (code *)0x14efaf;
    fs_event_unlink_files((uv_timer_t *)0x0);
    pcStackY_2d8 = (code *)0x14efbb;
    remove("watch_dir/");
    pcStackY_2d8 = (code *)0x14efc0;
    puVar4 = uv_default_loop();
    pcStackY_2d8 = (code *)0x14efd4;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    pcStackY_2d8 = (code *)0x14efde;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStackY_2d8 = (code *)0x14efe3;
    loop = (uv_timer_t *)uv_default_loop();
    pcStackY_2d8 = (code *)0x14efeb;
    iVar2 = uv_loop_close((uv_loop_t *)loop);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStackY_2d8 = (code *)0x14eff8;
    run_test_fs_event_close_in_callback_cold_1();
LAB_0014eff8:
    pcStackY_2d8 = (code *)0x14effd;
    run_test_fs_event_close_in_callback_cold_2();
LAB_0014effd:
    pcStackY_2d8 = (code *)0x14f002;
    run_test_fs_event_close_in_callback_cold_3();
LAB_0014f002:
    pcStackY_2d8 = (code *)0x14f007;
    run_test_fs_event_close_in_callback_cold_4();
LAB_0014f007:
    pcStackY_2d8 = (code *)0x14f00c;
    run_test_fs_event_close_in_callback_cold_5();
LAB_0014f00c:
    pcStackY_2d8 = (code *)0x14f011;
    run_test_fs_event_close_in_callback_cold_6();
  }
  pcStackY_2d8 = fs_event_cb_close;
  run_test_fs_event_close_in_callback_cold_7();
  if (iVar3 == 0) {
    if (fs_event_cb_called < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        uv_close((uv_handle_t *)loop,close_cb);
        return;
      }
      return;
    }
  }
  else {
    auStackY_2e8._8_8_ = 0x14f047;
    fs_event_cb_close_cold_1();
  }
  auStackY_2e8._8_8_ = run_test_fs_event_start_and_close;
  fs_event_cb_close_cold_2();
  auStackY_2e8._8_8_ = "watch_dir/file1";
  auStackY_2e8._0_8_ = puVar4;
  puVar5 = uv_default_loop();
  create_dir("watch_dir");
  handle = (code *)&uStackY_370;
  puVar4 = puVar5;
  iVar2 = uv_fs_event_init(puVar5,(uv_fs_event_t *)handle);
  if (iVar2 == 0) {
    handle = fs_event_cb_dir;
    puVar4 = (uv_loop_t *)&uStackY_370;
    iVar3 = 0;
    iVar2 = uv_fs_event_start((uv_fs_event_t *)puVar4,fs_event_cb_dir,"watch_dir",0);
    if (iVar2 != 0) goto LAB_0014f167;
    handle = (code *)&uStackY_3f8;
    puVar4 = puVar5;
    iVar2 = uv_fs_event_init(puVar5,(uv_fs_event_t *)handle);
    if (iVar2 != 0) goto LAB_0014f16c;
    handle = fs_event_cb_dir;
    puVar4 = (uv_loop_t *)&uStackY_3f8;
    iVar3 = 0;
    iVar2 = uv_fs_event_start((uv_fs_event_t *)puVar4,fs_event_cb_dir,"watch_dir",0);
    if (iVar2 != 0) goto LAB_0014f171;
    uv_close((uv_handle_t *)&uStackY_3f8,close_cb);
    uv_close((uv_handle_t *)&uStackY_370,close_cb);
    handle = (code *)0x0;
    puVar4 = puVar5;
    uv_run(puVar5,UV_RUN_DEFAULT);
    if (close_cb_called != 2) goto LAB_0014f176;
    remove("watch_dir/");
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    handle = (code *)0x0;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_0014f167:
    run_test_fs_event_start_and_close_cold_2();
LAB_0014f16c:
    run_test_fs_event_start_and_close_cold_3();
LAB_0014f171:
    run_test_fs_event_start_and_close_cold_4();
LAB_0014f176:
    run_test_fs_event_start_and_close_cold_5();
  }
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar4 == (uv_loop_t *)&fs_event) {
    if (iVar3 != 0) goto LAB_0014f1db;
    if (extraout_EDX != 2) goto LAB_0014f1e0;
    iVar3 = strcmp((char *)handle,"file1");
    if (iVar3 != 0) goto LAB_0014f1e5;
    iVar3 = uv_fs_event_stop(&fs_event);
    if (iVar3 == 0) {
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_0014f1db:
    fs_event_cb_dir_cold_2();
LAB_0014f1e0:
    fs_event_cb_dir_cold_3();
LAB_0014f1e5:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puStackY_438 = puVar5;
  puVar4 = uv_default_loop();
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  lVar7 = 0;
  do {
    iVar3 = uv_fs_event_init(puVar4,&fs_event);
    if (iVar3 != 0) {
LAB_0014f3e4:
      run_test_fs_event_getpath_cold_1();
      goto LAB_0014f3e9;
    }
    sStackY_848 = 0x400;
    iVar3 = uv_fs_event_getpath(&fs_event,acStackY_840,&sStackY_848);
    if (iVar3 != -0x16) {
LAB_0014f3df:
      run_test_fs_event_getpath_cold_2();
      goto LAB_0014f3e4;
    }
    path = *(char **)((long)&DAT_001e1c10 + lVar7);
    iVar3 = uv_fs_event_start(&fs_event,fail_cb,path,0);
    if (iVar3 != 0) {
LAB_0014f3da:
      run_test_fs_event_getpath_cold_3();
      goto LAB_0014f3df;
    }
    sStackY_848 = 0;
    iVar3 = uv_fs_event_getpath(&fs_event,acStackY_840,&sStackY_848);
    sVar1 = sStackY_848;
    if (iVar3 != -0x69) {
LAB_0014f3d5:
      run_test_fs_event_getpath_cold_4();
      goto LAB_0014f3da;
    }
    if (0x3ff < sStackY_848) {
LAB_0014f3d0:
      run_test_fs_event_getpath_cold_5();
      goto LAB_0014f3d5;
    }
    sVar6 = strlen(path);
    if (sVar1 != sVar6 + 1) {
LAB_0014f3cb:
      run_test_fs_event_getpath_cold_6();
      goto LAB_0014f3d0;
    }
    iVar3 = uv_fs_event_getpath(&fs_event,acStackY_840,&sStackY_848);
    sVar1 = sStackY_848;
    if (iVar3 != 0) {
LAB_0014f3c6:
      run_test_fs_event_getpath_cold_7();
      goto LAB_0014f3cb;
    }
    sVar6 = strlen(path);
    if (sVar1 != sVar6) {
LAB_0014f3c1:
      run_test_fs_event_getpath_cold_8();
      goto LAB_0014f3c6;
    }
    iVar3 = strcmp(acStackY_840,path);
    if (iVar3 != 0) {
LAB_0014f3bc:
      run_test_fs_event_getpath_cold_9();
      goto LAB_0014f3c1;
    }
    iVar3 = uv_fs_event_stop(&fs_event);
    if (iVar3 != 0) {
LAB_0014f3b7:
      run_test_fs_event_getpath_cold_10();
      goto LAB_0014f3bc;
    }
    uv_close((uv_handle_t *)&fs_event,close_cb);
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (close_cb_called != 1) {
      run_test_fs_event_getpath_cold_11();
      goto LAB_0014f3b7;
    }
    close_cb_called = 0;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x28);
  remove("watch_dir/");
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar3 = uv_loop_close(puVar4);
  if (iVar3 == 0) {
    return;
  }
LAB_0014f3e9:
  run_test_fs_event_getpath_cold_12();
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar3 = uv_loop_close(puVar4);
  if (iVar3 == 0) {
    return;
  }
  run_test_fs_event_error_reporting_cold_1();
  puVar8 = (uv_fs_event_t *)uv_default_loop();
  iVar3 = uv_fs_event_init((uv_loop_t *)puVar8,&fs_event);
  if (iVar3 == 0) {
    puVar8 = &fs_event;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar3 == 0) goto LAB_0014f4e6;
    puVar8 = &fs_event;
    iVar3 = uv_is_active((uv_handle_t *)&fs_event);
    if (iVar3 != 0) goto LAB_0014f4eb;
    puVar8 = &fs_event;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar3 == 0) goto LAB_0014f4f0;
    puVar8 = &fs_event;
    iVar3 = uv_is_active((uv_handle_t *)&fs_event);
    if (iVar3 == 0) {
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar8 = (uv_fs_event_t *)uv_default_loop();
      iVar3 = uv_loop_close((uv_loop_t *)puVar8);
      if (iVar3 == 0) {
        return;
      }
      goto LAB_0014f4fa;
    }
  }
  else {
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_0014f4e6:
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_0014f4eb:
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_0014f4f0:
    run_test_fs_event_watch_invalid_path_cold_5();
  }
  run_test_fs_event_watch_invalid_path_cold_3();
LAB_0014f4fa:
  run_test_fs_event_watch_invalid_path_cold_4();
  iVar3 = uv_is_closing((uv_handle_t *)puVar8);
  if (iVar3 != 0) {
    return;
  }
  uv_close((uv_handle_t *)puVar8,(uv_close_cb)0x0);
  return;
}

Assistant:

static void touch_file(const char* name, unsigned int size) {
  uv_file file;
  uv_fs_t req;
  uv_buf_t buf;
  int r;
  unsigned int i;

  r = uv_fs_open(NULL, &req, name, O_WRONLY | O_CREAT | O_TRUNC,
                 S_IWUSR | S_IRUSR, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT(r >= 0);
  file = r;

  buf = uv_buf_init("a", 1);

  /* Inefficient but simple. */
  for (i = 0; i < size; i++) {
    r = uv_fs_write(NULL, &req, file, &buf, 1, i, NULL);
    uv_fs_req_cleanup(&req);
    ASSERT(r >= 0);
  }

  r = uv_fs_close(NULL, &req, file, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT(r == 0);
}